

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YSet.cpp
# Opt level: O1

YError __thiscall
Yedis::YSet::smember
          (YSet *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *params,ReplyBuffer *reply)

{
  void *pvVar1;
  YObject *pYVar2;
  YError YVar3;
  undefined8 *puVar4;
  
  pYVar2 = getSet(this,(params->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1,reply);
  if (pYVar2 == (YObject *)0x0) {
    ReplyBuffer::pushData(reply,"-ERR error type\r\n",0xf);
    YVar3 = YError_type;
  }
  else {
    pvVar1 = pYVar2->value;
    YedisFormate::preFormatMultiBulk(*(size_t *)((long)pvVar1 + 0x18),reply);
    YVar3 = YError_ok;
    for (puVar4 = *(undefined8 **)((long)pvVar1 + 0x10); puVar4 != (undefined8 *)0x0;
        puVar4 = (undefined8 *)*puVar4) {
      YedisFormate::formatBulk((string *)(puVar4 + 1),reply);
    }
  }
  return YVar3;
}

Assistant:

YError YSet::smember(const std::vector<std::string>& params, ReplyBuffer* reply)
{
    YObject* value = getSet(params[1], reply);
    if(value == nullptr)
    {
        reply->pushData("-ERR error type\r\n", sizeof("-ERR error type") -1);
        return YError_type;
    }

    auto set = value->castSet();
    Yedis::YedisFormate::preFormatMultiBulk(set->size(), reply);
    for (const auto& member : *set)
    {
        Yedis::YedisFormate::formatBulk(member, reply);
    }
    return YError_ok;
}